

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

void google::protobuf::internal::arena_destruct_object<std::__cxx11::string>(void *object)

{
  if (*object != (long *)((long)object + 0x10)) {
    operator_delete(*object,*(long *)((long)object + 0x10) + 1);
    return;
  }
  return;
}

Assistant:

void arena_destruct_object(void* object) {
  reinterpret_cast<T*>(object)->~T();
}